

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O1

int bam_read1(BGZF *fp,bam1_t *b)

{
  int iVar1;
  ssize_t sVar2;
  long lVar3;
  uint8_t *puVar4;
  uint uVar5;
  int iVar6;
  int32_t block_len;
  uint32_t x [8];
  uint local_3c;
  uint local_38 [8];
  
  sVar2 = bgzf_read(fp,&local_3c,4);
  if ((int)sVar2 == 0) {
    iVar6 = -1;
  }
  else if ((int)sVar2 == 4) {
    sVar2 = bgzf_read(fp,local_38,0x20);
    iVar6 = -3;
    if (sVar2 == 0x20) {
      if ((fp->field_0x2 & 0xc) != 0) {
        local_3c = local_3c >> 0x18 | (local_3c & 0xff0000) >> 8 | (local_3c & 0xff00) << 8 |
                   local_3c << 0x18;
        lVar3 = 0;
        do {
          uVar5 = local_38[lVar3];
          local_38[lVar3] =
               uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
          lVar3 = lVar3 + 1;
        } while (lVar3 != 8);
      }
      (b->core).tid = local_38[0];
      (b->core).pos = local_38[1];
      uVar5 = (local_38[2] & 0xff00) << 8;
      *(ulong *)&(b->core).field_0x8 =
           (ulong)uVar5 | CONCAT44(*(undefined4 *)&(b->core).field_0xc,local_38[2] >> 0x10) |
           (ulong)(local_38[2] << 0x18);
      *(ulong *)&(b->core).field_0x8 =
           (ulong)local_38[3] << 0x30 | (ulong)(local_38[3] >> 0x10) << 0x20 |
           (ulong)(uVar5 | local_38[2] >> 0x10 | local_38[2] << 0x18);
      (b->core).l_qseq = local_38[4];
      (b->core).mtid = local_38[5];
      (b->core).mpos = local_38[6];
      (b->core).isize = local_38[7];
      uVar5 = local_3c - 0x20;
      b->l_data = uVar5;
      iVar6 = -4;
      if ((-1 < (int)local_38[4] && 0x1f < (int)local_3c) &&
         (((ulong)local_38[4] + 1 >> 1) +
          (ulong)(local_38[2] & 0xff) + (ulong)(ushort)local_38[3] * 4 + (ulong)local_38[4] <=
          (ulong)uVar5)) {
        if (b->m_data < (int)uVar5) {
          uVar5 = (int)(local_3c - 0x21) >> 1 | local_3c - 0x21;
          uVar5 = (int)uVar5 >> 2 | uVar5;
          uVar5 = (int)uVar5 >> 4 | uVar5;
          uVar5 = (int)uVar5 >> 8 | uVar5;
          iVar1 = ((int)uVar5 >> 0x10 | uVar5) + 1;
          b->m_data = iVar1;
          puVar4 = (uint8_t *)realloc(b->data,(long)iVar1);
          b->data = puVar4;
          if (puVar4 == (uint8_t *)0x0) {
            return -4;
          }
        }
        sVar2 = bgzf_read(fp,b->data,(long)b->l_data);
        if (sVar2 == b->l_data) {
          if ((fp->field_0x2 & 0xc) != 0) {
            swap_data(&b->core,b->l_data,b->data,0);
          }
          iVar6 = local_3c + 4;
        }
      }
    }
  }
  else {
    iVar6 = -2;
  }
  return iVar6;
}

Assistant:

int bam_read1(BGZF *fp, bam1_t *b)
{
    bam1_core_t *c = &b->core;
    int32_t block_len, ret, i;
    uint32_t x[8];
    if ((ret = bgzf_read(fp, &block_len, 4)) != 4) {
        if (ret == 0) return -1; // normal end-of-file
        else return -2; // truncated
    }
    if (bgzf_read(fp, x, 32) != 32) return -3;
    if (fp->is_be) {
        ed_swap_4p(&block_len);
        for (i = 0; i < 8; ++i) ed_swap_4p(x + i);
    }
    c->tid = x[0]; c->pos = x[1];
    c->bin = x[2]>>16; c->qual = x[2]>>8&0xff; c->l_qname = x[2]&0xff;
    c->flag = x[3]>>16; c->n_cigar = x[3]&0xffff;
    c->l_qseq = x[4];
    c->mtid = x[5]; c->mpos = x[6]; c->isize = x[7];
    b->l_data = block_len - 32;
    if (b->l_data < 0 || c->l_qseq < 0) return -4;
    if ((char *)bam_get_aux(b) - (char *)b->data > b->l_data)
        return -4;
    if (b->m_data < b->l_data) {
        b->m_data = b->l_data;
        kroundup32(b->m_data);
        b->data = (uint8_t*)realloc(b->data, b->m_data);
        if (!b->data)
            return -4;
    }
    if (bgzf_read(fp, b->data, b->l_data) != b->l_data) return -4;
    //b->l_aux = b->l_data - c->n_cigar * 4 - c->l_qname - c->l_qseq - (c->l_qseq+1)/2;
    if (fp->is_be) swap_data(c, b->l_data, b->data, 0);
    return 4 + block_len;
}